

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

int32_t uhash_iputi_63(UHashtable *hash,int32_t key,int32_t value,UErrorCode *status)

{
  UHashTok key_00;
  UHashTok UVar1;
  undefined4 local_38;
  undefined4 uStack_2c;
  UHashTok valueholder;
  UHashTok keyholder;
  UErrorCode *status_local;
  int32_t value_local;
  int32_t key_local;
  UHashtable *hash_local;
  
  key_00._4_4_ = valueholder._4_4_;
  key_00.integer = key;
  UVar1._4_4_ = uStack_2c;
  UVar1.integer = value;
  UVar1 = _uhash_put(hash,key_00,UVar1,'\0',status);
  local_38 = UVar1.integer;
  return local_38;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uhash_iputi(UHashtable *hash,
           int32_t key,
           int32_t value,
           UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.integer = key;
    valueholder.integer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      0, /* neither is a ptr */
                      status).integer;
}